

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.cpp
# Opt level: O0

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::LimitPercentModifier::Copy(LimitPercentModifier *this)

{
  bool bVar1;
  pointer pPVar2;
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_> in_RDI;
  templated_unique_single_t copy;
  unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>_>
  *in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  undefined1 local_38 [24];
  undefined1 local_20 [32];
  
  make_uniq<duckdb::LimitPercentModifier>();
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      *)0x23af5d);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_ffffffffffffff90);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(local_20);
    unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
    ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                  *)in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_ffffffffffffff90,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_ffffffffffffff88);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x23afbe);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      *)0x23affe);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_ffffffffffffff90);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(local_38);
    in_stack_ffffffffffffff90 =
         unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
         ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                       *)in_stack_ffffffffffffff90);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_ffffffffffffff90,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_ffffffffffffff88);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x23b05c);
  }
  unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>::
  unique_ptr<duckdb::LimitPercentModifier,std::default_delete<std::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>>>,void>
            ((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
  ::~unique_ptr((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                 *)0x23b091);
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (__uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
         .super__Head_base<0UL,_duckdb::ResultModifier_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ResultModifier> LimitPercentModifier::Copy() const {
	auto copy = make_uniq<LimitPercentModifier>();
	if (limit) {
		copy->limit = limit->Copy();
	}
	if (offset) {
		copy->offset = offset->Copy();
	}
	return std::move(copy);
}